

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::TreePop(void)

{
  ImU32 *pIVar1;
  ImGuiWindow *pIVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  ImRect local_28;
  
  pIVar3 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  Unindent(0.0);
  iVar6 = (pIVar2->DC).TreeDepth + -1;
  uVar7 = 1 << ((byte)iVar6 & 0x1f);
  (pIVar2->DC).TreeDepth = iVar6;
  if ((pIVar3->NavMoveDir == 0) && (pIVar3->NavWindow == pIVar2)) {
    bVar4 = NavMoveRequestButNoResultYet();
    if ((bVar4) &&
       ((pIVar3->NavIdIsAlive == true && (((pIVar2->DC).TreeJumpToParentOnPopMask & uVar7) != 0))))
    {
      lVar5 = (long)(pIVar2->IDStack).Size;
      if (lVar5 < 1) {
        __assert_fail("Size > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.h"
                      ,0x70b,"T &ImVector<unsigned int>::back() [T = unsigned int]");
      }
      local_28.Min.x = 0.0;
      local_28.Min.y = 0.0;
      local_28.Max.x = 0.0;
      local_28.Max.y = 0.0;
      SetNavID((pIVar2->IDStack).Data[lVar5 + -1],pIVar3->NavLayer,0,&local_28);
      NavMoveRequestCancel();
    }
  }
  pIVar1 = &(pIVar2->DC).TreeJumpToParentOnPopMask;
  *pIVar1 = *pIVar1 & uVar7 - 1;
  if (1 < (pIVar2->IDStack).Size) {
    PopID();
    return;
  }
  __assert_fail("window->IDStack.Size > 1",
                "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui_widgets.cpp"
                ,0x17aa,"void ImGui::TreePop()");
}

Assistant:

void ImGui::TreePop()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    Unindent();

    window->DC.TreeDepth--;
    ImU32 tree_depth_mask = (1 << window->DC.TreeDepth);

    // Handle Left arrow to move to parent tree node (when ImGuiTreeNodeFlags_NavLeftJumpsBackHere is enabled)
    if (g.NavMoveDir == ImGuiDir_Left && g.NavWindow == window && NavMoveRequestButNoResultYet())
        if (g.NavIdIsAlive && (window->DC.TreeJumpToParentOnPopMask & tree_depth_mask))
        {
            SetNavID(window->IDStack.back(), g.NavLayer, 0, ImRect());
            NavMoveRequestCancel();
        }
    window->DC.TreeJumpToParentOnPopMask &= tree_depth_mask - 1;

    IM_ASSERT(window->IDStack.Size > 1); // There should always be 1 element in the IDStack (pushed during window creation). If this triggers you called TreePop/PopID too much.
    PopID();
}